

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlib.cpp
# Opt level: O3

int stringToInteger(string *str)

{
  istream *piVar1;
  long *plVar2;
  size_type *psVar3;
  int value;
  istringstream stream;
  int local_1d4;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  long local_190 [4];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_190,(string *)str,_S_in);
  piVar1 = (istream *)std::istream::operator>>((istream *)local_190,&local_1d4);
  std::ws<char,std::char_traits<char>>(piVar1);
  if ((*(uint *)((long)auStack_170 + *(long *)(local_190[0] + -0x18)) & 7) != 2) {
    std::operator+(&local_1b0,"stringToInteger: Illegal integer format (",str);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1b0);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_1d0.field_2._M_allocated_capacity = *psVar3;
      local_1d0.field_2._8_8_ = plVar2[3];
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *psVar3;
      local_1d0._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_1d0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    error(&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_190);
  std::ios_base::~ios_base(local_118);
  return local_1d4;
}

Assistant:

int stringToInteger(string str) {
   istringstream stream(str);
   int value;
   stream >> value >> ws;
   if (stream.fail() || !stream.eof()) {
      error("stringToInteger: Illegal integer format (" + str + ")");
   }
   return value;
}